

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O0

void printDeviceTable(ostream *oss,
                     vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                     *devices,bool print_header,bool iponly,bool serialonly)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference this;
  uint64_t uVar2;
  uint64_t uVar3;
  reference this_00;
  ulong uVar4;
  byte in_CL;
  byte in_DL;
  undefined8 in_RSI;
  byte in_R8B;
  string *name;
  value_type *print;
  DeviceInfo *info;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  DeviceInfo *last_info;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  to_be_printed;
  value_type *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc0;
  value_type *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  allocator_type *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  iterator in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  string *local_2f0;
  string *local_268;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  string local_1f8 [32];
  string local_1d8 [32];
  string *local_1b8;
  string local_1b0 [32];
  value_type *local_190;
  string local_188 [20];
  uint32_t in_stack_fffffffffffffe8c;
  __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  local_158;
  undefined8 local_150;
  reference local_148;
  undefined1 local_13a;
  allocator<char> local_139;
  allocator<char> local_138;
  allocator<char> local_137;
  allocator<char> local_136;
  ostream local_135 [20];
  allocator<char> local_121;
  string *local_120;
  string local_118 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f8;
  uint64_t in_stack_ffffffffffffff28;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  string *local_58;
  undefined8 local_50;
  byte local_13;
  byte local_12;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  local_10 = in_RSI;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)0x13b4a4);
  if ((local_11 & 1) != 0) {
    local_13a = 1;
    local_120 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    in_stack_fffffffffffffde8 = &local_f8;
    in_stack_fffffffffffffdf0 = local_135;
    local_120 = (string *)in_stack_fffffffffffffde8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    local_120 = (string *)&stack0xffffffffffffff28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    local_120 = (string *)local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    local_120 = (string *)local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    local_120 = (string *)local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    local_13a = 0;
    local_58 = local_118;
    local_50 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x13b6b5);
    __l._M_len = (size_type)in_stack_fffffffffffffd00;
    __l._M_array = in_stack_fffffffffffffcf8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),__l,
             in_stack_fffffffffffffce8);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcd0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x13b70d);
    local_268 = (string *)&local_58;
    do {
      local_268 = local_268 + -0x20;
      std::__cxx11::string::~string(local_268);
    } while (local_268 != local_118);
    std::allocator<char>::~allocator(&local_139);
    std::allocator<char>::~allocator(&local_138);
    std::allocator<char>::~allocator(&local_137);
    std::allocator<char>::~allocator(&local_136);
    std::allocator<char>::~allocator((allocator<char> *)local_135);
    std::allocator<char>::~allocator(&local_121);
  }
  local_148 = (reference)0x0;
  local_150 = local_10;
  local_158._M_current =
       (DeviceInfo *)
       std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                 ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                  in_stack_fffffffffffffcb8);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             in_stack_fffffffffffffcb8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                        *)in_stack_fffffffffffffcc0,
                       (__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                        *)in_stack_fffffffffffffcb8);
    if (!bVar1) {
      printTable(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffffcd0);
      return;
    }
    this = __gnu_cxx::
           __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
           ::operator*(&local_158);
    if (local_148 == (reference)0x0) {
LAB_0013bb32:
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::emplace_back<>((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffcc0);
      local_190 = (value_type *)
                  std::
                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffcc0);
      if ((local_12 & 1) == 0) {
        if ((local_13 & 1) == 0) {
          rcdiscover::DeviceInfo::getUserName_abi_cxx11_(this);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            in_stack_fffffffffffffd08 = rcdiscover::DeviceInfo::getUserName_abi_cxx11_(this);
            local_2f0 = in_stack_fffffffffffffd08;
          }
          else {
            local_2f0 = rcdiscover::DeviceInfo::getModelName_abi_cxx11_(this);
          }
          local_1b8 = local_2f0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffd00 = rcdiscover::DeviceInfo::getSerialNumber_abi_cxx11_(this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          rcdiscover::DeviceInfo::getIP(this);
          ip2string_abi_cxx11_(in_stack_fffffffffffffe8c);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          std::__cxx11::string::~string(local_1d8);
          rcdiscover::DeviceInfo::getMAC(this);
          mac2string_abi_cxx11_(in_stack_ffffffffffffff28);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          std::__cxx11::string::~string(local_1f8);
          in_stack_fffffffffffffcc8 = local_190;
          in_stack_fffffffffffffcd0 = rcdiscover::DeviceInfo::getModelName_abi_cxx11_(this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffcb8 = local_190;
          in_stack_fffffffffffffcc0 = rcdiscover::DeviceInfo::getIfaceName_abi_cxx11_(this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          local_148 = this;
        }
        else {
          rcdiscover::DeviceInfo::getSerialNumber_abi_cxx11_(this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          local_148 = this;
        }
      }
      else {
        rcdiscover::DeviceInfo::getIP(this);
        ip2string_abi_cxx11_(in_stack_fffffffffffffe8c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(local_1b0);
        local_148 = this;
      }
    }
    else {
      uVar2 = rcdiscover::DeviceInfo::getMAC(this);
      uVar3 = rcdiscover::DeviceInfo::getMAC(local_148);
      if (((uVar2 != uVar3) || ((local_12 & 1) != 0)) || ((local_13 & 1) != 0)) goto LAB_0013bb32;
      rcdiscover::DeviceInfo::getIfaceName_abi_cxx11_(this);
      std::operator+((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_fffffffffffffcc0);
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator+=((string *)this_00,local_188);
      std::__cxx11::string::~string(local_188);
    }
    __gnu_cxx::
    __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
    ::operator++(&local_158);
  } while( true );
}

Assistant:

void printDeviceTable(std::ostream &oss,
                      const std::vector<rcdiscover::DeviceInfo> &devices,
                      bool print_header,
                      bool iponly, bool serialonly)
{
  std::vector<std::vector<std::string>> to_be_printed;

  if (print_header)
  {
    to_be_printed.push_back({"Name", "Serial Number", "IP", "MAC", "Model", "Interface(s)"});
  }

  const rcdiscover::DeviceInfo *last_info = nullptr;
  for (const auto &info : devices)
  {
    if (last_info)
    {
      if (info.getMAC() == last_info->getMAC() && !iponly && !serialonly)
      {
        // append this interface to the existing interface list
        to_be_printed.back().back() += "," + info.getIfaceName();
        continue;
      }
    }

    to_be_printed.emplace_back();
    auto &print = to_be_printed.back();

    if (iponly)
    {
      print.push_back(ip2string(info.getIP()));
    }
    else if (serialonly)
    {
      print.push_back(info.getSerialNumber());
    }
    else
    {
      const std::string &name = info.getUserName().empty()
                                ? info.getModelName()
                                : info.getUserName();

      print.push_back(name);
      print.push_back(info.getSerialNumber());
      print.push_back(ip2string(info.getIP()));
      print.push_back(mac2string(info.getMAC()));
      print.push_back(info.getModelName());
      print.push_back(info.getIfaceName());
    }

    last_info = &info;
  }

  printTable(oss, to_be_printed);
}